

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls_wrapper.cpp
# Opt level: O0

void __thiscall
duckdb_mbedtls::MbedTlsWrapper::AESStateMBEDTLS::AESStateMBEDTLS(AESStateMBEDTLS *this,string *key)

{
  int iVar1;
  mbedtls_cipher_info_t *this_00;
  EncryptionState *in_RDI;
  size_t unaff_retaddr;
  AESStateMBEDTLS *in_stack_00000008;
  mbedtls_cipher_info_t *cipher_info;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  unique_ptr<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_>
  *in_stack_ffffffffffffffa0;
  runtime_error local_48 [16];
  runtime_error local_38 [16];
  mbedtls_cipher_info_t *local_28;
  
  duckdb::EncryptionState::EncryptionState(in_RDI,(string *)0x0);
  in_RDI->_vptr_EncryptionState = (_func_int **)&PTR__AESStateMBEDTLS_03552f08;
  *(undefined4 *)((long)&in_RDI[1]._vptr_EncryptionState + 4) = 0;
  duckdb::make_uniq<mbedtls_cipher_context_t>();
  std::unique_ptr<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_>::get
            (in_stack_ffffffffffffffa0);
  mbedtls_cipher_init((mbedtls_cipher_context_t *)0x2725e2d);
  std::__cxx11::string::length();
  this_00 = GetCipher(in_stack_00000008,unaff_retaddr);
  local_28 = this_00;
  if (this_00 == (mbedtls_cipher_info_t *)0x0) {
    std::runtime_error::runtime_error(local_38,"Failed to get Cipher");
    std::runtime_error::~runtime_error(local_38);
  }
  std::unique_ptr<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_>::get
            ((unique_ptr<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_> *
             )this_00);
  iVar1 = mbedtls_cipher_setup
                    ((mbedtls_cipher_context_t *)
                     CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                     (mbedtls_cipher_info_t *)0x2725ec3);
  if (iVar1 != 0) {
    std::runtime_error::runtime_error(local_48,"Failed to initialize cipher context");
    std::runtime_error::~runtime_error(local_48);
  }
  return;
}

Assistant:

MbedTlsWrapper::AESStateMBEDTLS::AESStateMBEDTLS(const std::string *key) : context(duckdb::make_uniq<mbedtls_cipher_context_t>()) {
	mbedtls_cipher_init(context.get());

	auto cipher_info = GetCipher(key->length());
	if (!cipher_info) {
		runtime_error("Failed to get Cipher");
	}

	if (mbedtls_cipher_setup(context.get(), cipher_info) != 0) {
		runtime_error("Failed to initialize cipher context");
	}
}